

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O2

bool __thiscall HasJSON::operator()(HasJSON *this,UniValue *value)

{
  long lVar1;
  __type_conflict _Var2;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  char *local_90;
  char *local_88;
  undefined **local_80;
  undefined1 local_78;
  undefined1 *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  string json;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::write_abi_cxx11_((UniValue *)&json,(int)value,(void *)0x0,0);
  local_50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x24;
  file.m_begin = (iterator)&local_50;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
  local_78 = 0;
  local_80 = &PTR__lazy_ostream_01139f30;
  local_70 = boost::unit_test::lazy_ostream::inst;
  local_68 = "";
  local_90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/rpc_tests.cpp"
  ;
  local_88 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_80,&local_90,0x24,1,2,&json,"json",this,"m_json");
  _Var2 = std::operator==(&json,&this->m_json);
  std::__cxx11::string::~string((string *)&json);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return _Var2;
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const UniValue& value) const
    {
        std::string json{value.write()};
        BOOST_CHECK_EQUAL(json, m_json);
        return json == m_json;
    }